

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  ImGuiWindow *pIVar1;
  value_type *pvVar2;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindow();
  ImVector<ImGuiGroupData>::resize(&(pIVar1->DC).GroupStack,(pIVar1->DC).GroupStack.Size + 1);
  pvVar2 = ImVector<ImGuiGroupData>::back(&(pIVar1->DC).GroupStack);
  pvVar2->BackupCursorPos = (pIVar1->DC).CursorPos;
  pvVar2->BackupCursorMaxPos = (pIVar1->DC).CursorMaxPos;
  pvVar2->BackupIndentX = (pIVar1->DC).IndentX;
  pvVar2->BackupGroupOffsetX = (pIVar1->DC).GroupOffsetX;
  pvVar2->BackupCurrentLineHeight = (pIVar1->DC).CurrentLineHeight;
  pvVar2->BackupCurrentLineTextBaseOffset = (pIVar1->DC).CurrentLineTextBaseOffset;
  pvVar2->BackupLogLinePosY = (pIVar1->DC).LogLinePosY;
  pvVar2->BackupActiveIdIsAlive = (bool)(GImGui->ActiveIdIsAlive & 1);
  pvVar2->AdvanceCursor = true;
  (pIVar1->DC).GroupOffsetX =
       ((pIVar1->DC).CursorPos.x - (pIVar1->Pos).x) - (pIVar1->DC).ColumnsOffsetX;
  (pIVar1->DC).IndentX = (pIVar1->DC).GroupOffsetX;
  (pIVar1->DC).CursorMaxPos = (pIVar1->DC).CursorPos;
  (pIVar1->DC).CurrentLineHeight = 0.0;
  (pIVar1->DC).LogLinePosY = (pIVar1->DC).CursorPos.y - 9999.0;
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndentX = window->DC.IndentX;
    group_data.BackupGroupOffsetX = window->DC.GroupOffsetX;
    group_data.BackupCurrentLineHeight = window->DC.CurrentLineHeight;
    group_data.BackupCurrentLineTextBaseOffset = window->DC.CurrentLineTextBaseOffset;
    group_data.BackupLogLinePosY = window->DC.LogLinePosY;
    group_data.BackupActiveIdIsAlive = GImGui->ActiveIdIsAlive;
    group_data.AdvanceCursor = true;

    window->DC.GroupOffsetX = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffsetX;
    window->DC.IndentX = window->DC.GroupOffsetX;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrentLineHeight = 0.0f;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;
}